

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GaussianPlumeRecord.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::GaussianPlumeRecord::Encode(GaussianPlumeRecord *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  GaussianPlumeRecord *this_local;
  
  pKVar1 = KDataStream::operator<<(stream,(this->super_EnvironmentRecord).m_ui32EnvRecTyp);
  pKVar1 = KDataStream::operator<<(pKVar1,(this->super_EnvironmentRecord).m_ui16Length);
  pKVar1 = KDataStream::operator<<(pKVar1,(this->super_EnvironmentRecord).m_ui8Index);
  pKVar1 = KDataStream::operator<<(pKVar1,(this->super_EnvironmentRecord).m_ui8Padding);
  pKVar1 = DATA_TYPE::operator<<(pKVar1,&(this->m_SrcLocation).super_DataTypeBase);
  pKVar1 = DATA_TYPE::operator<<(pKVar1,&(this->m_Ori).super_DataTypeBase);
  pKVar1 = DATA_TYPE::operator<<(pKVar1,&(this->m_PlumeLWH).super_DataTypeBase);
  pKVar1 = DATA_TYPE::operator<<(pKVar1,&(this->m_DDTLEH).super_DataTypeBase);
  pKVar1 = KDataStream::operator<<(pKVar1,(float)this->m_f32LdEdgeCenHght);
  pKVar1 = DATA_TYPE::operator<<(pKVar1,&(this->m_LdEdgeVel).super_DataTypeBase);
  KDataStream::operator<<(pKVar1,this->m_ui32Padding);
  return;
}

Assistant:

void GaussianPlumeRecord::Encode( KDataStream & stream ) const
{
    stream << m_ui32EnvRecTyp
           << m_ui16Length
           << m_ui8Index
           << m_ui8Padding
           << KDIS_STREAM m_SrcLocation
           << KDIS_STREAM m_Ori
           << KDIS_STREAM m_PlumeLWH
           << KDIS_STREAM m_DDTLEH
           << m_f32LdEdgeCenHght
           << KDIS_STREAM m_LdEdgeVel
           << m_ui32Padding;
}